

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

int __thiscall
icu_63::TimeZoneFormat::clone
          (TimeZoneFormat *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  TimeZoneFormat *this_00;
  undefined8 local_30;
  TimeZoneFormat *this_local;
  
  this_00 = (TimeZoneFormat *)UMemory::operator_new((UMemory *)0x530,(size_t)__fn);
  local_30 = (TimeZoneFormat *)0x0;
  if (this_00 != (TimeZoneFormat *)0x0) {
    TimeZoneFormat(this_00,this);
    local_30 = this_00;
  }
  return (int)local_30;
}

Assistant:

Format*
TimeZoneFormat::clone() const {
    return new TimeZoneFormat(*this);
}